

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppProfile(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  uint uVar1;
  uint uVar2;
  uint i;
  
  if (nVars < 1) {
    nVars = 0;
  }
  for (i = 0; nVars != i; i = i + 1) {
    uVar1 = Vec_WecLevelSize(pS,i);
    uVar2 = Vec_WecLevelSize(pD,i);
    printf("%2d : S = %3d  D = %3d\n",(ulong)i,(ulong)uVar1,(ulong)uVar2);
  }
  return;
}

Assistant:

void Abc_SuppProfile( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        printf( "%2d : S = %3d  D = %3d\n", v, Vec_WecLevelSize(pS, v), Vec_WecLevelSize(pD, v) );
}